

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

optional<pbrt::CameraRayDifferential> *
pbrt::CameraBase::GenerateRayDifferential
          (optional<pbrt::CameraRayDifferential> *__return_storage_ptr__,CameraHandle *camera,
          CameraSample sample,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  undefined4 uVar2;
  ulong uVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  short sVar7;
  CameraSample sample_00;
  CameraSample sample_01;
  CameraSample sample_02;
  CameraSample sample_03;
  CameraSample sample_04;
  CameraSample sample_05;
  CameraSample sample_06;
  CameraSample sample_07;
  Point2f PVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  bool bVar14;
  PerspectiveCamera *pPVar15;
  byte bVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  optional<pbrt::CameraRay> cr;
  float local_178 [4];
  aligned_storage_t<sizeof(pbrt::CameraRay),_alignof(pbrt::CameraRay)> local_168;
  char local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  anon_struct_8_0_00000001_for___align local_118;
  undefined8 uStack_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined8 local_c8;
  optional<pbrt::CameraRayDifferential> *local_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  aligned_storage_t<sizeof(pbrt::CameraRay),_alignof(pbrt::CameraRay)> local_88;
  char local_50;
  anon_struct_8_0_00000001_for___align local_48;
  undefined8 uStack_40;
  
  uVar3 = (camera->
          super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
          ).bits;
  pPVar15 = (PerspectiveCamera *)(uVar3 & 0xffffffffffff);
  sVar7 = (short)(uVar3 >> 0x30);
  if (uVar3 >> 0x30 < 3) {
    if (sVar7 == 2) {
      OrthographicCamera::GenerateRay
                ((optional<pbrt::CameraRay> *)&local_88.__align,(OrthographicCamera *)pPVar15,sample
                 ,lambda);
    }
    else {
      PerspectiveCamera::GenerateRay
                ((optional<pbrt::CameraRay> *)&local_88.__align,pPVar15,sample,lambda);
    }
  }
  else if (sVar7 == 3) {
    SphericalCamera::GenerateRay
              ((optional<pbrt::CameraRay> *)&local_88.__align,(SphericalCamera *)pPVar15,sample,
               lambda);
  }
  else {
    RealisticCamera::GenerateRay
              ((optional<pbrt::CameraRay> *)&local_88.__align,(RealisticCamera *)pPVar15,sample,
               lambda);
  }
  local_c0 = __return_storage_ptr__;
  if (local_50 == '\0') {
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  else {
    local_118 = local_88.__align;
    uStack_110 = local_88._8_8_;
    local_128 = local_88._16_8_;
    uStack_120 = 0;
    local_178[3] = (float)local_88._24_4_;
    local_c8 = local_88._32_8_;
    local_178[0] = 0.05;
    local_178[1] = -0.05;
    lVar17 = 0;
    bVar14 = false;
    do {
      local_d8 = ZEXT416((uint)*(float *)((long)local_178 + lVar17));
      fVar4 = *(float *)((long)local_178 + lVar17) +
              sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x;
      uVar3 = (camera->
              super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
              ).bits;
      pPVar15 = (PerspectiveCamera *)(uVar3 & 0xffffffffffff);
      sVar7 = (short)(uVar3 >> 0x30);
      PVar8 = sample.pLens.super_Tuple2<pbrt::Point2,_float>;
      uVar1 = sample._16_8_;
      if (uVar3 < 0x3000000000000) {
        if (sVar7 == 2) {
          sample_00.pFilm.super_Tuple2<pbrt::Point2,_float>.y =
               sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y;
          sample_00.pFilm.super_Tuple2<pbrt::Point2,_float>.x = fVar4;
          sample_00.pLens.super_Tuple2<pbrt::Point2,_float> =
               PVar8.super_Tuple2<pbrt::Point2,_float>;
          sample_00.time = (Float)(int)uVar1;
          sample_00.weight = (Float)(int)((ulong)uVar1 >> 0x20);
          OrthographicCamera::GenerateRay
                    ((optional<pbrt::CameraRay> *)&local_168.__align,(OrthographicCamera *)pPVar15,
                     sample_00,(SampledWavelengths *)0x3000000000000);
        }
        else {
          sample_02.pFilm.super_Tuple2<pbrt::Point2,_float>.y =
               sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y;
          sample_02.pFilm.super_Tuple2<pbrt::Point2,_float>.x = fVar4;
          sample_02.pLens.super_Tuple2<pbrt::Point2,_float> =
               PVar8.super_Tuple2<pbrt::Point2,_float>;
          sample_02.time = (Float)(int)uVar1;
          sample_02.weight = (Float)(int)((ulong)uVar1 >> 0x20);
          PerspectiveCamera::GenerateRay
                    ((optional<pbrt::CameraRay> *)&local_168.__align,pPVar15,sample_02,
                     (SampledWavelengths *)0x3000000000000);
        }
      }
      else if (sVar7 == 3) {
        sample_01.pFilm.super_Tuple2<pbrt::Point2,_float>.y =
             sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y;
        sample_01.pFilm.super_Tuple2<pbrt::Point2,_float>.x = fVar4;
        sample_01.pLens.super_Tuple2<pbrt::Point2,_float> = PVar8.super_Tuple2<pbrt::Point2,_float>;
        sample_01.time = (Float)(int)uVar1;
        sample_01.weight = (Float)(int)((ulong)uVar1 >> 0x20);
        SphericalCamera::GenerateRay
                  ((optional<pbrt::CameraRay> *)&local_168.__align,(SphericalCamera *)pPVar15,
                   sample_01,(SampledWavelengths *)0x3000000000000);
      }
      else {
        sample_03.pFilm.super_Tuple2<pbrt::Point2,_float>.y =
             sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y;
        sample_03.pFilm.super_Tuple2<pbrt::Point2,_float>.x = fVar4;
        sample_03.pLens.super_Tuple2<pbrt::Point2,_float> = PVar8.super_Tuple2<pbrt::Point2,_float>;
        sample_03.time = (Float)(int)uVar1;
        sample_03.weight = (Float)(int)((ulong)uVar1 >> 0x20);
        RealisticCamera::GenerateRay
                  ((optional<pbrt::CameraRay> *)&local_168.__align,(RealisticCamera *)pPVar15,
                   sample_03,(SampledWavelengths *)0x3000000000000);
      }
      if (bVar14) {
        bVar14 = false;
      }
      if (local_130 == '\x01') {
        local_108._8_8_ = 0;
        local_108._0_8_ = local_168.__align;
        local_e8._8_8_ = 0;
        local_e8._0_8_ = local_168._12_8_;
        local_130 = '\0';
        local_f8 = vinsertps_avx(local_168._20_16_,ZEXT416((uint)local_168._8_4_),0x10);
        bVar14 = true;
      }
      if (bVar14 != false) {
        auVar18._8_8_ = uStack_110;
        auVar18._0_8_ = local_118;
        auVar5 = vsubps_avx(local_108,auVar18);
        auVar21._4_4_ = local_d8._0_4_;
        auVar21._0_4_ = local_d8._0_4_;
        auVar21._8_4_ = local_d8._0_4_;
        auVar21._12_4_ = local_d8._0_4_;
        auVar5 = vdivps_avx(auVar5,auVar21);
        local_98 = local_118._0_4_ + auVar5._0_4_;
        fStack_94 = local_118._4_4_ + auVar5._4_4_;
        fStack_90 = (float)uStack_110 + auVar5._8_4_;
        fStack_8c = (float)((ulong)uStack_110 >> 0x20) + auVar5._12_4_;
        auVar6._8_8_ = uStack_120;
        auVar6._0_8_ = local_128;
        auVar19 = vpermi2ps_avx512vl(_DAT_00579bf0,auVar18,auVar6);
        auVar5 = vsubps_avx(local_f8,auVar19);
        auVar5 = vdivps_avx(auVar5,auVar21);
        auVar18 = vpermi2ps_avx512vl(_DAT_00579c00,auVar6,auVar18);
        auVar6 = vsubps_avx(local_e8,auVar18);
        auVar6 = vdivps_avx(auVar6,auVar21);
        local_a8 = auVar18._0_4_ + auVar6._0_4_;
        fStack_a4 = auVar18._4_4_ + auVar6._4_4_;
        fStack_a0 = auVar18._8_4_ + auVar6._8_4_;
        fStack_9c = auVar18._12_4_ + auVar6._12_4_;
        local_b8 = auVar19._0_4_ + auVar5._0_4_;
        fStack_b4 = auVar19._4_4_ + auVar5._4_4_;
        fStack_b0 = auVar19._8_4_ + auVar5._8_4_;
        fStack_ac = auVar19._12_4_ + auVar5._12_4_;
        goto LAB_0032e6d8;
      }
      lVar17 = lVar17 + 4;
    } while (lVar17 != 8);
    local_b8 = 0.0;
    fStack_b4 = 0.0;
    fStack_b0 = 0.0;
    fStack_ac = 0.0;
    local_98 = 0.0;
    fStack_94 = 0.0;
    fStack_90 = 0.0;
    fStack_8c = 0.0;
    local_a8 = 0.0;
    fStack_a4 = 0.0;
    fStack_a0 = 0.0;
    fStack_9c = 0.0;
LAB_0032e6d8:
    local_178[0] = 0.05;
    local_178[1] = -0.05;
    local_d8._0_4_ = sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y;
    lVar17 = 0;
    bVar16 = 0;
    do {
      local_e8 = ZEXT416((uint)*(float *)((long)local_178 + lVar17));
      fVar4 = *(float *)((long)local_178 + lVar17) + (float)local_d8._0_4_;
      uVar3 = (camera->
              super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
              ).bits;
      pPVar15 = (PerspectiveCamera *)(uVar3 & 0xffffffffffff);
      sVar7 = (short)(uVar3 >> 0x30);
      if (uVar3 < 0x3000000000000) {
        if (sVar7 == 2) {
          sample_04.pFilm.super_Tuple2<pbrt::Point2,_float>.y = fVar4;
          sample_04.pFilm.super_Tuple2<pbrt::Point2,_float>.x =
               sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x;
          sample_04.pLens.super_Tuple2<pbrt::Point2,_float> =
               PVar8.super_Tuple2<pbrt::Point2,_float>;
          sample_04.time = (Float)(int)uVar1;
          sample_04.weight = (Float)(int)((ulong)uVar1 >> 0x20);
          OrthographicCamera::GenerateRay
                    ((optional<pbrt::CameraRay> *)&local_168.__align,(OrthographicCamera *)pPVar15,
                     sample_04,(SampledWavelengths *)0x3000000000000);
        }
        else {
          sample_06.pFilm.super_Tuple2<pbrt::Point2,_float>.y = fVar4;
          sample_06.pFilm.super_Tuple2<pbrt::Point2,_float>.x =
               sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x;
          sample_06.pLens.super_Tuple2<pbrt::Point2,_float> =
               PVar8.super_Tuple2<pbrt::Point2,_float>;
          sample_06.time = (Float)(int)uVar1;
          sample_06.weight = (Float)(int)((ulong)uVar1 >> 0x20);
          PerspectiveCamera::GenerateRay
                    ((optional<pbrt::CameraRay> *)&local_168.__align,pPVar15,sample_06,
                     (SampledWavelengths *)0x3000000000000);
        }
      }
      else if (sVar7 == 3) {
        sample_05.pFilm.super_Tuple2<pbrt::Point2,_float>.y = fVar4;
        sample_05.pFilm.super_Tuple2<pbrt::Point2,_float>.x =
             sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x;
        sample_05.pLens.super_Tuple2<pbrt::Point2,_float> = PVar8.super_Tuple2<pbrt::Point2,_float>;
        sample_05.time = (Float)(int)uVar1;
        sample_05.weight = (Float)(int)((ulong)uVar1 >> 0x20);
        SphericalCamera::GenerateRay
                  ((optional<pbrt::CameraRay> *)&local_168.__align,(SphericalCamera *)pPVar15,
                   sample_05,(SampledWavelengths *)0x3000000000000);
      }
      else {
        sample_07.pFilm.super_Tuple2<pbrt::Point2,_float>.y = fVar4;
        sample_07.pFilm.super_Tuple2<pbrt::Point2,_float>.x =
             sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x;
        sample_07.pLens.super_Tuple2<pbrt::Point2,_float> = PVar8.super_Tuple2<pbrt::Point2,_float>;
        sample_07.time = (Float)(int)uVar1;
        sample_07.weight = (Float)(int)((ulong)uVar1 >> 0x20);
        RealisticCamera::GenerateRay
                  ((optional<pbrt::CameraRay> *)&local_168.__align,(RealisticCamera *)pPVar15,
                   sample_07,(SampledWavelengths *)0x3000000000000);
      }
      if (bVar16 != 0) {
        bVar16 = 0;
      }
      if (local_130 == '\x01') {
        local_48 = local_168.__align;
        uStack_40 = 0;
        local_f8._8_8_ = 0;
        local_f8._0_8_ = local_168._12_8_;
        local_130 = '\0';
        local_108 = vinsertps_avx(local_168._20_16_,ZEXT416((uint)local_168._8_4_),0x10);
        bVar16 = 1;
      }
      if (bVar16 != 0) {
        auVar10._8_8_ = uStack_110;
        auVar10._0_8_ = local_118;
        auVar5._8_8_ = uStack_40;
        auVar5._0_8_ = local_48;
        auVar5 = vsubps_avx(auVar5,auVar10);
        auVar23._4_4_ = local_e8._0_4_;
        auVar23._0_4_ = local_e8._0_4_;
        auVar23._8_4_ = local_e8._0_4_;
        auVar23._12_4_ = local_e8._0_4_;
        auVar5 = vdivps_avx(auVar5,auVar23);
        auVar20._0_4_ = local_118._0_4_ + auVar5._0_4_;
        auVar20._4_4_ = local_118._4_4_ + auVar5._4_4_;
        auVar20._8_4_ = (float)uStack_110 + auVar5._8_4_;
        auVar20._12_4_ = (float)((ulong)uStack_110 >> 0x20) + auVar5._12_4_;
        auVar19._8_8_ = uStack_120;
        auVar19._0_8_ = local_128;
        auVar18 = vpermi2ps_avx512vl(_DAT_00579bf0,auVar10,auVar19);
        auVar5 = vsubps_avx(local_108,auVar18);
        auVar5 = vdivps_avx(auVar5,auVar23);
        auVar19 = vpermi2ps_avx512vl(_DAT_00579c00,auVar19,auVar10);
        auVar6 = vsubps_avx(local_f8,auVar19);
        auVar6 = vdivps_avx(auVar6,auVar23);
        auVar22._0_4_ = auVar19._0_4_ + auVar6._0_4_;
        auVar22._4_4_ = auVar19._4_4_ + auVar6._4_4_;
        auVar22._8_4_ = auVar19._8_4_ + auVar6._8_4_;
        auVar22._12_4_ = auVar19._12_4_ + auVar6._12_4_;
        auVar24._0_4_ = auVar18._0_4_ + auVar5._0_4_;
        auVar24._4_4_ = auVar18._4_4_ + auVar5._4_4_;
        auVar24._8_4_ = auVar18._8_4_ + auVar5._8_4_;
        auVar24._12_4_ = auVar18._12_4_ + auVar5._12_4_;
        goto LAB_0032e8f3;
      }
      lVar17 = lVar17 + 4;
    } while (lVar17 != 8);
    auVar20 = ZEXT816(0) << 0x40;
    auVar22 = ZEXT816(0) << 0x40;
    auVar24 = ZEXT816(0) << 0x40;
LAB_0032e8f3:
    if (local_50 == '\0') {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
    }
    local_c0->set = true;
    *(anon_struct_8_0_00000001_for___align *)&local_c0->optionalValue = local_118;
    *(undefined8 *)((long)&local_c0->optionalValue + 8) = uStack_110;
    auVar9._8_8_ = uStack_120;
    auVar9._0_8_ = local_128;
    uVar1 = vmovlps_avx(auVar9);
    *(undefined8 *)((long)&local_c0->optionalValue + 0x10) = uVar1;
    *(float *)((long)&local_c0->optionalValue + 0x18) = local_178[3];
    *(undefined8 *)((long)&local_c0->optionalValue + 0x20) = local_c8;
    (local_c0->optionalValue).__data[0x28] = bVar14 & bVar16;
    auVar13._4_4_ = fStack_94;
    auVar13._0_4_ = local_98;
    auVar13._8_4_ = fStack_90;
    auVar13._12_4_ = fStack_8c;
    uVar1 = vmovlps_avx(auVar13);
    *(undefined8 *)((long)&local_c0->optionalValue + 0x2c) = uVar1;
    auVar11._4_4_ = fStack_b4;
    auVar11._0_4_ = local_b8;
    auVar11._8_4_ = fStack_b0;
    auVar11._12_4_ = fStack_ac;
    uVar2 = vextractps_avx(auVar11,1);
    *(undefined4 *)((long)&local_c0->optionalValue + 0x34) = uVar2;
    uVar1 = vmovlps_avx(auVar20);
    *(undefined8 *)((long)&local_c0->optionalValue + 0x38) = uVar1;
    uVar2 = vextractps_avx(auVar24,1);
    *(undefined4 *)((long)&local_c0->optionalValue + 0x40) = uVar2;
    auVar12._4_4_ = fStack_a4;
    auVar12._0_4_ = local_a8;
    auVar12._8_4_ = fStack_a0;
    auVar12._12_4_ = fStack_9c;
    uVar1 = vmovlps_avx(auVar12);
    *(undefined8 *)((long)&local_c0->optionalValue + 0x44) = uVar1;
    *(float *)((long)&local_c0->optionalValue + 0x4c) = local_b8;
    uVar1 = vmovlps_avx(auVar22);
    *(undefined8 *)((long)&local_c0->optionalValue + 0x50) = uVar1;
    *(int *)((long)&local_c0->optionalValue + 0x58) = auVar24._0_4_;
    *(undefined8 *)((long)&local_c0->optionalValue + 0x60) = local_88._40_8_;
    *(undefined8 *)((long)&local_c0->optionalValue + 0x68) = local_88._48_8_;
  }
  return local_c0;
}

Assistant:

pstd::optional<CameraRayDifferential> CameraBase::GenerateRayDifferential(
    CameraHandle camera, CameraSample sample, SampledWavelengths &lambda) {
    // Generate regular camera ray _cr_ for ray differential
    pstd::optional<CameraRay> cr = camera.GenerateRay(sample, lambda);
    if (!cr)
        return {};
    RayDifferential rd(cr->ray);

    // Find camera ray after shifting one pixel in the $x$ direction
    pstd::optional<CameraRay> rx;
    for (Float eps : {.05f, -.05f}) {
        CameraSample sshift = sample;
        sshift.pFilm.x += eps;
        // Try to generate ray with _sshift_ and compute $x$ differential
        if (rx = camera.GenerateRay(sshift, lambda); rx) {
            rd.rxOrigin = rd.o + (rx->ray.o - rd.o) / eps;
            rd.rxDirection = rd.d + (rx->ray.d - rd.d) / eps;
            break;
        }
    }

    // Find camera ray after shifting one pixel in the $y$ direction
    pstd::optional<CameraRay> ry;
    for (Float eps : {.05f, -.05f}) {
        CameraSample sshift = sample;
        sshift.pFilm.y += eps;
        if (ry = camera.GenerateRay(sshift, lambda); ry) {
            rd.ryOrigin = rd.o + (ry->ray.o - rd.o) / eps;
            rd.ryDirection = rd.d + (ry->ray.d - rd.d) / eps;
            break;
        }
    }

    // Return approximate ray differential and weight
    rd.hasDifferentials = rx && ry;
    return CameraRayDifferential{rd, cr->weight};
}